

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,BinaryExpr *node)

{
  long *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::Expression,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             &(node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*local_28 + 0x10))(local_28,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  if (node->op != Member) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Expression,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_28,
               &(node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*local_28 + 0x10))(local_28,this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  return;
}

Assistant:

void operator()(ast::BinaryExpr &node) const override {
    visit(node.lhs);
    if (node.op != ast::BinaryExpr::Member)
      visit(node.rhs);
  }